

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<4>::operator==(SquareMatrix<4> *this,SquareMatrix<4> *m2)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  Float *pFVar6;
  Float *pFVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  pFVar6 = m2->m[0] + 1;
  pFVar7 = this->m[0] + 1;
  uVar8 = 0;
  bVar10 = false;
  do {
    fVar2 = this->m[uVar8][0];
    fVar3 = m2->m[uVar8][0];
    if (fVar2 != fVar3) {
      return bVar10;
    }
    if (NAN(fVar2) || NAN(fVar3)) {
      return bVar10;
    }
    uVar9 = 0xffffffffffffffff;
    do {
      if (uVar9 == 2) goto LAB_00290fa8;
      lVar4 = uVar9 + 1;
      uVar1 = uVar9 + 1;
      lVar5 = uVar9 + 1;
    } while ((pFVar7[lVar4] == pFVar6[lVar5]) &&
            (uVar9 = uVar1, !NAN(pFVar7[lVar4]) && !NAN(pFVar6[lVar5])));
    if (uVar1 < 3) {
      return bVar10;
    }
LAB_00290fa8:
    bVar10 = 2 < uVar8;
    uVar8 = uVar8 + 1;
    pFVar6 = pFVar6 + 4;
    pFVar7 = pFVar7 + 4;
    if (uVar8 == 4) {
      return bVar10;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return false;
        return true;
    }